

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3<double> * pbrt::Cross<double>(Vector3<double> *v,Vector3<double> *w)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Vector3<double> *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (v->super_Tuple3<pbrt::Vector3,_double>).x;
  dVar1 = (v->super_Tuple3<pbrt::Vector3,_double>).z;
  auVar7._8_8_ = dVar1;
  auVar7._0_8_ = dVar1;
  auVar3._0_8_ = (w->super_Tuple3<pbrt::Vector3,_double>).y;
  auVar3._8_8_ = (w->super_Tuple3<pbrt::Vector3,_double>).z;
  dVar1 = (w->super_Tuple3<pbrt::Vector3,_double>).x;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  dVar2 = (w->super_Tuple3<pbrt::Vector3,_double>).z;
  auVar9._8_8_ = dVar2;
  auVar9._0_8_ = dVar2;
  auVar4._0_8_ = (v->super_Tuple3<pbrt::Vector3,_double>).y;
  auVar4._8_8_ = (v->super_Tuple3<pbrt::Vector3,_double>).z;
  auVar7 = vunpcklpd_avx(auVar7,auVar6);
  auVar9 = vunpcklpd_avx(auVar9,auVar5);
  auVar8._0_8_ = (double)auVar3._0_8_ * auVar7._0_8_;
  auVar8._8_8_ = (double)auVar3._8_8_ * auVar7._8_8_;
  auVar9 = vfmsub213pd_fma(auVar9,auVar4,auVar8);
  auVar7 = vfnmadd213pd_fma(auVar7,auVar3,auVar8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (double)auVar4._0_8_ * dVar1;
  auVar3 = vfmsub213sd_fma(auVar3,auVar6,auVar10);
  auVar4 = vfnmadd213sd_fma(auVar5,auVar4,auVar10);
  (in_RDI->super_Tuple3<pbrt::Vector3,_double>).x = auVar9._0_8_ + auVar7._0_8_;
  (in_RDI->super_Tuple3<pbrt::Vector3,_double>).y = auVar9._8_8_ + auVar7._8_8_;
  (in_RDI->super_Tuple3<pbrt::Vector3,_double>).z = auVar3._0_8_ + auVar4._0_8_;
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline Vector3<T> Cross(const Vector3<T> &v, const Vector3<T> &w) {
    DCHECK(!v.HasNaN() && !w.HasNaN());
    return {DifferenceOfProducts(v.y, w.z, v.z, w.y),
            DifferenceOfProducts(v.z, w.x, v.x, w.z),
            DifferenceOfProducts(v.x, w.y, v.y, w.x)};
}